

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1Pagecount(sqlite3_pcache *p)

{
  int iVar1;
  long in_RDI;
  PCache1 *pCache;
  int n;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x1b0501);
  iVar1 = *(int *)(in_RDI + 0x28);
  sqlite3_mutex_leave((sqlite3_mutex *)0x1b051b);
  return iVar1;
}

Assistant:

static int pcache1Pagecount(sqlite3_pcache *p){
  int n;
  PCache1 *pCache = (PCache1*)p;
  pcache1EnterMutex(pCache->pGroup);
  n = pCache->nPage;
  pcache1LeaveMutex(pCache->pGroup);
  return n;
}